

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall
QMessageBoxPrivate::addOldButtons(QMessageBoxPrivate *this,int button0,int button1,int button2)

{
  QMessageBox *this_00;
  long lVar1;
  QPushButton *pQVar2;
  QAbstractButton *button;
  StandardButton SVar3;
  
  this_00 = *(QMessageBox **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  SVar3 = button0 & 0xfffffcff;
  if (button0 - 1U < 0x3ff) {
    SVar3 = NoButton;
  }
  lVar1 = *(long *)&(this_00->super_QDialog).super_QWidget.field_0x8;
  pQVar2 = QDialogButtonBox::addButton(*(QDialogButtonBox **)(lVar1 + 0x2f8),SVar3);
  if (pQVar2 != (QPushButton *)0x0) {
    *(undefined1 *)(lVar1 + 0x349) = 0;
  }
  SVar3 = button1 & 0xfffffcff;
  if (button1 - 1U < 0x3ff) {
    SVar3 = NoButton;
  }
  lVar1 = *(long *)&(this_00->super_QDialog).super_QWidget.field_0x8;
  pQVar2 = QDialogButtonBox::addButton(*(QDialogButtonBox **)(lVar1 + 0x2f8),SVar3);
  if (pQVar2 != (QPushButton *)0x0) {
    *(undefined1 *)(lVar1 + 0x349) = 0;
  }
  SVar3 = NoButton;
  if (0x3fe < button2 - 1U) {
    SVar3 = button2 & 0xfffffcff;
  }
  lVar1 = *(long *)&(this_00->super_QDialog).super_QWidget.field_0x8;
  pQVar2 = QDialogButtonBox::addButton(*(QDialogButtonBox **)(lVar1 + 0x2f8),SVar3);
  if (pQVar2 != (QPushButton *)0x0) {
    *(undefined1 *)(lVar1 + 0x349) = 0;
  }
  pQVar2 = (QPushButton *)findButton(this,button0,button1,button2,0x100);
  QMessageBox::setDefaultButton(this_00,pQVar2);
  button = findButton(this,button0,button1,button2,0x200);
  QMessageBox::setEscapeButton(this_00,button);
  this->compatMode = (button0 - 1U < 0x3ff || button1 - 1U < 0x3ff) || button2 - 1U < 0x3ff;
  return;
}

Assistant:

void QMessageBoxPrivate::addOldButtons(int button0, int button1, int button2)
{
    Q_Q(QMessageBox);
    q->addButton(newButton(button0));
    q->addButton(newButton(button1));
    q->addButton(newButton(button2));
    q->setDefaultButton(
        static_cast<QPushButton *>(findButton(button0, button1, button2, QMessageBox::Default)));
    q->setEscapeButton(findButton(button0, button1, button2, QMessageBox::Escape));
    compatMode = detectedCompat(button0, button1, button2);
}